

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition.hpp
# Opt level: O0

bool bcl::
     check_detailed_balance<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
               (vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *transition_matrix,double tolerance)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double extraout_XMM0_Qa;
  size_t j;
  size_t i;
  size_t n;
  value_type sum;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff98;
  double in_stack_ffffffffffffffa0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffb0;
  ulong __n;
  ulong local_48;
  
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff98);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff98);
  dVar3 = std::
          accumulate<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
  local_48 = 0;
  do {
    if (sVar1 <= local_48) {
      return true;
    }
    for (__n = 0; __n < sVar1; __n = __n + 1) {
      std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_48);
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_RSI,local_48);
      std::vector<double,_std::allocator<double>_>::operator[](pvVar2,__n);
      std::vector<double,_std::allocator<double>_>::operator[](in_RDI,__n);
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_RSI,__n);
      std::vector<double,_std::allocator<double>_>::operator[](pvVar2,local_48);
      std::abs((int)pvVar2);
      if (in_XMM0_Qa * dVar3 < extraout_XMM0_Qa) {
        return false;
      }
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

bool check_detailed_balance(VEC const& weights, MAT const& transition_matrix,
  double tolerance = 1.0e-10) {
  typedef typename VEC::value_type value_type;
  value_type sum = std::accumulate(weights.begin(), weights.end(), value_type(0));
  std::size_t n = weights.size();
  for (std::size_t i = 0; i < n; ++i)
    for (std::size_t j = 0; j < n; ++j)
      if (std::abs(weights[i] * transition_matrix[i][j] - weights[j] * transition_matrix[j][i]) >
          tolerance * sum) return false;
  return true;
}